

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Accessors(void)

{
  __type _Var1;
  bool bVar2;
  ErrorCode EVar3;
  string *__rhs;
  ostream *poVar4;
  ulong uVar5;
  LogMessage local_800;
  LogMessage local_680;
  LogMessage local_500;
  undefined1 local_380 [8];
  RE2 re_1;
  undefined1 local_120 [8];
  RE2 re;
  allocator local_29;
  string local_28 [8];
  string kPattern;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"http://([^/]+)/.*",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  RE2::RE2((RE2 *)local_120,(string *)local_28);
  __rhs = RE2::pattern_abi_cxx11_((RE2 *)local_120);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_28,__rhs);
  if (!_Var1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&re_1.named_groups_once_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x41e);
    poVar4 = LogMessage::stream((LogMessage *)&re_1.named_groups_once_);
    std::operator<<(poVar4,"Check failed: (kPattern) == (re.pattern())");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re_1.named_groups_once_);
  }
  RE2::~RE2((RE2 *)local_120);
  std::__cxx11::string::~string(local_28);
  RE2::RE2((RE2 *)local_380,"foo");
  RE2::error_abi_cxx11_((RE2 *)local_380);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_500,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x424);
    poVar4 = LogMessage::stream(&local_500);
    std::operator<<(poVar4,"Check failed: re.error().empty()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_500);
  }
  bVar2 = RE2::ok((RE2 *)local_380);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_680,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x425);
    poVar4 = LogMessage::stream(&local_680);
    std::operator<<(poVar4,"Check failed: re.ok()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_680);
  }
  EVar3 = RE2::error_code((RE2 *)local_380);
  if (EVar3 != NoError) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_800,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x426);
    poVar4 = LogMessage::stream(&local_800);
    std::operator<<(poVar4,"Check failed: re.error_code() == RE2::NoError");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_800);
  }
  RE2::~RE2((RE2 *)local_380);
  return;
}

Assistant:

TEST(RE2, Accessors) {
  // Check the pattern() accessor
  {
    const string kPattern = "http://([^/]+)/.*";
    const RE2 re(kPattern);
    CHECK_EQ(kPattern, re.pattern());
  }

  // Check RE2 error field.
  {
    RE2 re("foo");
    CHECK(re.error().empty());  // Must have no error
    CHECK(re.ok());
    CHECK(re.error_code() == RE2::NoError);
  }
}